

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  my_algorithm::testWeightDigraphAlgorithm();
  return 0;
}

Assistant:

int main(int argc, const char * argv[]) {
//    printf("quick\n");
//    my_algorithm::testQuickSort();
//    printf("\nmerge\n");
//    my_algorithm::testMergeSort();
//    printf("\nshell\n");
//    my_algorithm::testShellSort();
//    printf("\ninsertion\n");
//    my_algorithm::testInsertionSort();
//    printf("\nselection\n");
//    my_algorithm::testSelectionSort();
//    printf("\nbucket\n");
//    my_algorithm::testBucketSort();
//    printf("\nradix\n");
//    my_algorithm::testRadixSort();
//    printf("\nheap\n");
//    my_algorithm::testHeapSort();
    my_algorithm::testWeightDigraphAlgorithm();
    return 0;
}